

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_dxt.cpp
# Opt level: O3

char * crnlib::get_dxt_compressor_name(crn_dxt_compressor_type c)

{
  if (c < cCRNTotalDXTCompressors) {
    return &DAT_001a9b34 + *(int *)(&DAT_001a9b34 + (ulong)c * 4);
  }
  return "?";
}

Assistant:

const char* get_dxt_compressor_name(crn_dxt_compressor_type c)
    {
        switch (c)
        {
        case cCRNDXTCompressorCRN:
            return "CRN";
        case cCRNDXTCompressorCRNF:
            return "CRNF";
        case cCRNDXTCompressorRYG:
            return "RYG";
#if CRNLIB_SUPPORT_ATI_COMPRESS
        case cCRNDXTCompressorATI:
            return "ATI";
#endif
        default:
            break;
        }
        CRNLIB_ASSERT(false);
        return "?";
    }